

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrsBuild.c
# Opt level: O1

void Psr_ManRemapOne(Vec_Int_t *vSigs,Psr_Ntk_t *pNtkBox,Vec_Int_t *vMap)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  
  if (0 < (pNtkBox->vInputs).nSize) {
    lVar4 = 0;
    do {
      if ((pNtkBox->vInputs).nSize <= lVar4) goto LAB_0038d878;
      uVar1 = (pNtkBox->vInputs).pArray[lVar4];
      uVar5 = (ulong)uVar1;
      if (uVar5 == 0) break;
      if (((int)uVar1 < 0) || (vMap->nSize <= (int)uVar1)) goto LAB_0038d878;
      if (vMap->pArray[uVar5] != -1) {
        __assert_fail("Vec_IntEntry(vMap, NameId) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPrsBuild.c"
                      ,0x65,"void Psr_ManRemapOne(Vec_Int_t *, Psr_Ntk_t *, Vec_Int_t *)");
      }
      lVar4 = lVar4 + 1;
      vMap->pArray[uVar5] = (int)lVar4;
    } while (lVar4 < (pNtkBox->vInputs).nSize);
  }
  if (0 < (pNtkBox->vOutputs).nSize) {
    lVar4 = 0;
    do {
      if ((pNtkBox->vOutputs).nSize <= lVar4) goto LAB_0038d878;
      uVar1 = (pNtkBox->vOutputs).pArray[lVar4];
      uVar5 = (ulong)uVar1;
      if (uVar5 == 0) break;
      if (((int)uVar1 < 0) || (vMap->nSize <= (int)uVar1)) goto LAB_0038d878;
      if (vMap->pArray[uVar5] != -1) {
        __assert_fail("Vec_IntEntry(vMap, NameId) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPrsBuild.c"
                      ,0x6a,"void Psr_ManRemapOne(Vec_Int_t *, Psr_Ntk_t *, Vec_Int_t *)");
      }
      iVar3 = (int)lVar4;
      lVar4 = lVar4 + 1;
      vMap->pArray[uVar5] = (pNtkBox->vInputs).nSize + iVar3 + 1;
    } while (lVar4 < (pNtkBox->vOutputs).nSize);
  }
  if ((vSigs->nSize & 1) != 0) {
    __assert_fail("Vec_IntSize(vSigs) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPrsBuild.c"
                  ,0x6e,"void Psr_ManRemapOne(Vec_Int_t *, Psr_Ntk_t *, Vec_Int_t *)");
  }
  if (0 < vSigs->nSize) {
    piVar2 = vSigs->pArray;
    lVar4 = 0;
    do {
      iVar3 = piVar2[lVar4];
      if (((long)iVar3 < 0) || (vMap->nSize <= iVar3)) goto LAB_0038d878;
      if (vMap->pArray[iVar3] == -1) {
        __assert_fail("Vec_IntEntry(vMap, NameId) != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPrsBuild.c"
                      ,0x71,"void Psr_ManRemapOne(Vec_Int_t *, Psr_Ntk_t *, Vec_Int_t *)");
      }
      piVar2[lVar4] = vMap->pArray[iVar3];
      lVar4 = lVar4 + 2;
    } while ((int)lVar4 < vSigs->nSize);
  }
  if (0 < (pNtkBox->vInputs).nSize) {
    lVar4 = 0;
    do {
      if ((pNtkBox->vInputs).nSize <= lVar4) goto LAB_0038d878;
      uVar1 = (pNtkBox->vInputs).pArray[lVar4];
      if ((ulong)uVar1 == 0) break;
      if (((int)uVar1 < 0) || (vMap->nSize <= (int)uVar1)) goto LAB_0038d897;
      vMap->pArray[uVar1] = -1;
      lVar4 = lVar4 + 1;
    } while (lVar4 < (pNtkBox->vInputs).nSize);
  }
  if (0 < (pNtkBox->vOutputs).nSize) {
    lVar4 = 0;
    do {
      if ((pNtkBox->vOutputs).nSize <= lVar4) {
LAB_0038d878:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar1 = (pNtkBox->vOutputs).pArray[lVar4];
      if ((ulong)uVar1 == 0) {
        return;
      }
      if (((int)uVar1 < 0) || (vMap->nSize <= (int)uVar1)) {
LAB_0038d897:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      vMap->pArray[uVar1] = -1;
      lVar4 = lVar4 + 1;
    } while (lVar4 < (pNtkBox->vOutputs).nSize);
  }
  return;
}

Assistant:

void Psr_ManRemapOne( Vec_Int_t * vSigs, Psr_Ntk_t * pNtkBox, Vec_Int_t * vMap )
{
    int i, NameId;
    // map formal names into I/O indexes
    Psr_NtkForEachPi( pNtkBox, NameId, i )
    {
        assert( Vec_IntEntry(vMap, NameId) == -1 );
        Vec_IntWriteEntry( vMap, NameId, i + 1 ); // +1 to keep 1st form input non-zero
    }
    Psr_NtkForEachPo( pNtkBox, NameId, i )
    {
        assert( Vec_IntEntry(vMap, NameId) == -1 );
        Vec_IntWriteEntry( vMap, NameId, Psr_NtkPiNum(pNtkBox) + i + 1 ); // +1 to keep 1st form input non-zero
    }
    // remap box
    assert( Vec_IntSize(vSigs) % 2 == 0 );
    Vec_IntForEachEntry( vSigs, NameId, i )
    {
        assert( Vec_IntEntry(vMap, NameId) != -1 );
        Vec_IntWriteEntry( vSigs, i++, Vec_IntEntry(vMap, NameId) );
    }
    // unmap formal inputs
    Psr_NtkForEachPi( pNtkBox, NameId, i )
        Vec_IntWriteEntry( vMap, NameId, -1 );
    Psr_NtkForEachPo( pNtkBox, NameId, i )
        Vec_IntWriteEntry( vMap, NameId, -1 );
}